

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_writers.h
# Opt level: O0

void date::number_writer<2>::
     write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
               (ostreambuf_iterator<char,_std::char_traits<char>_> *dst,uchar value)

{
  char cVar1;
  value_type *pvVar2;
  ostreambuf_iterator<char,_std::char_traits<char>_> *poVar3;
  int local_34;
  undefined1 auStack_30 [4];
  int i;
  static_string<char,_11UL> digits;
  uchar value_local;
  ostreambuf_iterator<char,_std::char_traits<char>_> *dst_local;
  
  auStack_30[0] = '0';
  auStack_30[1] = '1';
  auStack_30[2] = '2';
  auStack_30[3] = '3';
  i._0_1_ = '4';
  i._1_1_ = '5';
  i._2_1_ = '6';
  i._3_1_ = '7';
  digits.m_data._M_elems[0] = '8';
  digits.m_data._M_elems[1] = '9';
  digits.m_data._M_elems[2] = '\0';
  digits.m_data._M_elems[3] = '\0';
  digits.m_data._M_elems[4] = '\0';
  digits.m_data._M_elems[5] = '\0';
  digits.m_data._M_elems[6] = '\0';
  digits.m_data._M_elems[7] = '\0';
  digits.m_data._M_elems[8] = '\n';
  digits.m_data._M_elems[9] = '\0';
  digits.m_data._M_elems[10] = '\0';
  digits._11_5_ = 0;
  if (value == '\0') {
    digits.m_length._7_1_ = 0;
    for (local_34 = 0; local_34 < 1; local_34 = local_34 + 1) {
      pvVar2 = static_string<char,_11UL>::operator[]((static_string<char,_11UL> *)auStack_30,0);
      cVar1 = *pvVar2;
      poVar3 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(dst,0);
      poVar3 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar3);
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(poVar3,cVar1);
    }
    pvVar2 = static_string<char,_11UL>::operator[]((static_string<char,_11UL> *)auStack_30,0);
    cVar1 = *pvVar2;
    poVar3 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(dst,0);
    poVar3 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar3);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(poVar3,cVar1);
  }
  else {
    digits.m_length._7_1_ = value;
    number_writer<1>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>
              (dst,value / 10);
    pvVar2 = static_string<char,_11UL>::operator[]
                       ((static_string<char,_11UL> *)auStack_30,
                        (long)(int)((uint)digits.m_length._7_1_ % 10));
    cVar1 = *pvVar2;
    poVar3 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(dst,0);
    poVar3 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar3);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(poVar3,cVar1);
  }
  return;
}

Assistant:

static void write(Iterator& dst, Number value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto digits = number_writer<0>::digits<char_type>();
        if (value == 0)
        {
            for (int i = 0; i < Width - 1; ++i)
                *(dst++) = digits[0];
            *(dst++) = digits[0];
            return;
        }
        number_writer<Width - 1>::write(dst, value / 10);
        *(dst++) = digits[value % 10];
    }